

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O3

void __thiscall cmFilePathChecksum::cmFilePathChecksum(cmFilePathChecksum *this)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  paVar2 = &this->parentDirs[0].second.field_2;
  lVar1 = 0x100;
  do {
    paVar2[-3]._M_allocated_capacity = (size_type)(paVar2 + -2);
    *(undefined8 *)((long)paVar2 + -0x28) = 0;
    paVar2[-2]._M_local_buf[0] = 0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar2 + -1))->
    _M_dataplus)._M_p = (pointer)paVar2;
    *(size_type *)((long)paVar2 + -8) = 0;
    paVar2->_M_local_buf[0] = '\0';
    paVar2 = paVar2 + 4;
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != 0);
  return;
}

Assistant:

cmFilePathChecksum::cmFilePathChecksum()
{
}